

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O1

void __thiscall
cmCPackArchiveGenerator::cmCPackArchiveGenerator
          (cmCPackArchiveGenerator *this,Compress compress,string *format,string *extension)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  cmCPackGenerator::cmCPackGenerator(&this->super_cmCPackGenerator);
  (this->super_cmCPackGenerator)._vptr_cmCPackGenerator = (_func_int **)&PTR_GetNameOfClass_00a9ef30
  ;
  this->Compress = compress;
  paVar2 = &(this->ArchiveFormat).field_2;
  (this->ArchiveFormat)._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (format->_M_dataplus)._M_p;
  paVar1 = &format->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&format->field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->ArchiveFormat).field_2 + 8) = uVar4;
  }
  else {
    (this->ArchiveFormat)._M_dataplus._M_p = pcVar3;
    (this->ArchiveFormat).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->ArchiveFormat)._M_string_length = format->_M_string_length;
  (format->_M_dataplus)._M_p = (pointer)paVar1;
  format->_M_string_length = 0;
  (format->field_2)._M_local_buf[0] = '\0';
  paVar2 = &(this->OutputExtension).field_2;
  (this->OutputExtension)._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (extension->_M_dataplus)._M_p;
  paVar1 = &extension->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&extension->field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->OutputExtension).field_2 + 8) = uVar4;
  }
  else {
    (this->OutputExtension)._M_dataplus._M_p = pcVar3;
    (this->OutputExtension).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->OutputExtension)._M_string_length = extension->_M_string_length;
  (extension->_M_dataplus)._M_p = (pointer)paVar1;
  extension->_M_string_length = 0;
  (extension->field_2)._M_local_buf[0] = '\0';
  return;
}

Assistant:

cmCPackArchiveGenerator::cmCPackArchiveGenerator(
  cmArchiveWrite::Compress compress, std::string format, std::string extension)
  : Compress(compress)
  , ArchiveFormat(std::move(format))
  , OutputExtension(std::move(extension))
{
}